

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

size_t pbrt::operator()(size_t size_,anon_class_16_2_fd512de7 *pred)

{
  bool bVar1;
  size_t sVar2;
  anon_class_16_2_fd512de7 *in_RSI;
  long in_RDI;
  bool predResult;
  size_t middle;
  size_t half;
  ssize_t first;
  ssize_t size;
  ulong local_48;
  long local_40;
  long local_20;
  ulong local_18;
  
  local_20 = 1;
  local_18 = in_RDI - 2;
  while (0 < (long)local_18) {
    local_48 = local_18 >> 1;
    bVar1 = RGBToSpectrumTable::operator()::anon_class_16_2_fd512de7::operator()
                      (in_RSI,(int)(local_20 + local_48));
    if (bVar1) {
      local_40 = local_20 + local_48 + 1;
    }
    else {
      local_40 = local_20;
    }
    local_20 = local_40;
    if (bVar1) {
      local_48 = local_18 - (local_48 + 1);
    }
    local_18 = local_48;
  }
  sVar2 = Clamp<long,int,unsigned_long>(local_20 + -1,0,in_RDI - 2);
  return sVar2;
}

Assistant:

PBRT_CPU_GPU inline size_t FindInterval(size_t size_, const Predicate &pred) {
    using ssize_t = std::make_signed_t<size_t>;  // Not all platforms have ssize_t
    ssize_t size = (ssize_t)size_ - 2, first = 1;

    while (size > 0) {
        size_t half = (size_t)size >> 1, middle = first + half;

        // .. and recurse into the left or right side
        bool predResult = pred(middle);
        first = predResult ? middle + 1 : first;
        size = predResult ? size - (half + 1) : half;
    }

    return (size_t)Clamp((ssize_t)first - 1, 0, size_ - 2);
}